

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O1

int Abc_NtkMfsAfterICheck
              (Abc_Ntk_t *p,int nFrames,int nFramesAdd,Vec_Int_t *vFlops,Sfm_Par_t *pPars)

{
  int iVar1;
  uint uVar2;
  undefined8 in_RAX;
  Abc_Ntk_t *pAVar3;
  Sfm_Ntk_t *p_00;
  Abc_Ntk_t *pAVar4;
  int iPivot;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  if (p->ntkType == ABC_NTK_LOGIC) {
    pAVar3 = p;
    iVar1 = Abc_NtkGetFaninMax(p);
    if (iVar1 < 7) {
      if (p->ntkFunc != ABC_FUNC_SOP) {
        Abc_NtkToSop(p,-1,1000000000);
      }
      pAVar3 = Abc_NtkUnrollAndDrop(p,nFrames,nFramesAdd,vFlops,&local_34);
      Io_WriteBlifLogic(pAVar3,"unroll_dump.blif",0);
      p_00 = Abc_NtkExtractMfs2(pAVar3,local_34);
      uVar2 = Sfm_NtkPerform(p_00,pPars);
      if (uVar2 != 0) {
        pAVar4 = pAVar3;
        Abc_NtkInsertMfs(pAVar3,p_00);
        if (pPars->fVerbose != 0) {
          Abc_Print((int)pAVar4,"The network has %d nodes changed by \"mfs\".\n",(ulong)uVar2);
        }
        Abc_NtkReinsertNodes(p,pAVar3,local_34);
      }
      Abc_NtkDelete(pAVar3);
      Sfm_NtkFree(p_00);
      Abc_NtkSweep(p,0);
      iVar1 = 1;
      if (p->ntkFunc != ABC_FUNC_SOP) {
        Abc_NtkToSop(p,-1,1000000000);
      }
    }
    else {
      iVar1 = 0;
      Abc_Print((int)pAVar3,
                "Currently \"mfs\" cannot process the network containing nodes with more than 6 fanins.\n"
               );
    }
    return iVar1;
  }
  __assert_fail("Abc_NtkIsLogic(p)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMfs.c"
                ,0x1b5,"int Abc_NtkMfsAfterICheck(Abc_Ntk_t *, int, int, Vec_Int_t *, Sfm_Par_t *)")
  ;
}

Assistant:

int Abc_NtkMfsAfterICheck( Abc_Ntk_t * p, int nFrames, int nFramesAdd, Vec_Int_t * vFlops, Sfm_Par_t * pPars )
{
    Sfm_Ntk_t * pp;
    int nFaninMax, nNodes;
    Abc_Ntk_t * pNtk;
    int iPivot;
    assert( Abc_NtkIsLogic(p) );
    // count fanouts
    nFaninMax = Abc_NtkGetFaninMax( p );
    if ( nFaninMax > 6 )
    {
        Abc_Print( 1, "Currently \"mfs\" cannot process the network containing nodes with more than 6 fanins.\n" );
        return 0;
    }
    if ( !Abc_NtkHasSop(p) )
        Abc_NtkToSop( p, -1, ABC_INFINITY );
    // derive unfolded network
    pNtk = Abc_NtkUnrollAndDrop( p, nFrames, nFramesAdd, vFlops, &iPivot );
    Io_WriteBlifLogic( pNtk, "unroll_dump.blif", 0 );
    // collect information
    pp = Abc_NtkExtractMfs2( pNtk, iPivot );
    // perform optimization
    nNodes = Sfm_NtkPerform( pp, pPars );
    if ( nNodes == 0 )
    {
//        Abc_Print( 1, "The network is not changed by \"mfs\".\n" );
    }
    else
    {
        Abc_NtkInsertMfs( pNtk, pp );
        if( pPars->fVerbose )
            Abc_Print( 1, "The network has %d nodes changed by \"mfs\".\n", nNodes );
        Abc_NtkReinsertNodes( p, pNtk, iPivot );
    }
    Abc_NtkDelete( pNtk );
    Sfm_NtkFree( pp );
    // perform final sweep
    Abc_NtkSweep( p, 0 );
    if ( !Abc_NtkHasSop(p) )
        Abc_NtkToSop( p, -1, ABC_INFINITY );
    return 1;

}